

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O3

uint32_t FAudioVoice_SetOutputVoices(FAudioVoice *voice,FAudioVoiceSends *pSendList)

{
  long lVar1;
  uint32_t uVar2;
  uint uVar3;
  FAudio *pFVar4;
  FAudioSendDescriptor *pFVar5;
  float **ppfVar6;
  FAudioMixCallback *pp_Var7;
  float *pfVar8;
  FAudioFilterParameters *pFVar9;
  FAudioFilterState **ppafVar10;
  FAudioFilterState *pafVar11;
  uint32_t uVar12;
  undefined **ppuVar13;
  long lVar14;
  size_t sVar15;
  ulong uVar16;
  FAudioSendDescriptor **ppFVar17;
  FAudioSendDescriptor defaultSend;
  FAudioVoiceSends local_4c;
  FAudioSendDescriptor local_3c;
  
  uVar12 = 0x88960001;
  if (voice->type == FAUDIO_VOICE_MASTER) {
    return 0x88960001;
  }
  FAudio_PlatformLockMutex(voice->sendLock);
  uVar2 = FAudio_INTERNAL_VoiceOutputFrequency(voice,pSendList);
  if (uVar2 == 0) {
    FAudio_PlatformLockMutex(voice->volumeLock);
    if ((voice->sends).SendCount == 0) {
      uVar3 = 0;
    }
    else {
      uVar16 = 0;
      do {
        (*voice->audio->pFree)(voice->sendCoefficients[uVar16]);
        uVar16 = uVar16 + 1;
        uVar3 = (voice->sends).SendCount;
      } while (uVar16 < uVar3);
    }
    if (voice->sendCoefficients != (float **)0x0) {
      (*voice->audio->pFree)(voice->sendCoefficients);
      uVar3 = (voice->sends).SendCount;
    }
    if (uVar3 != 0) {
      uVar16 = 0;
      do {
        (*voice->audio->pFree)(voice->mixCoefficients[uVar16]);
        uVar16 = uVar16 + 1;
      } while (uVar16 < (voice->sends).SendCount);
    }
    if (voice->mixCoefficients != (float **)0x0) {
      (*voice->audio->pFree)(voice->mixCoefficients);
    }
    if (voice->sendMix != (FAudioMixCallback *)0x0) {
      (*voice->audio->pFree)(voice->sendMix);
    }
    if (voice->sendFilter != (FAudioFilterParameters *)0x0) {
      (*voice->audio->pFree)(voice->sendFilter);
      voice->sendFilter = (FAudioFilterParameters *)0x0;
    }
    ppafVar10 = voice->sendFilterState;
    if (ppafVar10 != (FAudioFilterState **)0x0) {
      uVar3 = (voice->sends).SendCount;
      if (uVar3 != 0) {
        uVar16 = 0;
        do {
          if (voice->sendFilterState[uVar16] != (FAudioFilterState *)0x0) {
            (*voice->audio->pFree)(voice->sendFilterState[uVar16]);
            uVar3 = (voice->sends).SendCount;
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 < uVar3);
        ppafVar10 = voice->sendFilterState;
      }
      (*voice->audio->pFree)(ppafVar10);
      voice->sendFilterState = (FAudioFilterState **)0x0;
    }
    pFVar5 = (voice->sends).pSends;
    if (pFVar5 != (FAudioSendDescriptor *)0x0) {
      (*voice->audio->pFree)(pFVar5);
    }
    if (pSendList == (FAudioVoiceSends *)0x0) {
      local_3c.Flags = 0;
      pFVar4 = voice->audio;
      local_3c.pOutputVoice = pFVar4->master;
      pSendList = &local_4c;
      local_4c.SendCount = 1;
      ppFVar17 = &local_4c.pSends;
      local_4c.pSends = &local_3c;
      uVar12 = 1;
    }
    else {
      uVar12 = pSendList->SendCount;
      if (uVar12 == 0) {
        voice->sendCoefficients = (float **)0x0;
        voice->mixCoefficients = (float **)0x0;
        voice->sendMix = (FAudioMixCallback *)0x0;
        uVar12 = 0;
        SDL_memset(&voice->sends,0,0xc);
        FAudio_PlatformUnlockMutex(voice->volumeLock);
        goto LAB_00114990;
      }
      ppFVar17 = &pSendList->pSends;
      pFVar4 = voice->audio;
    }
    (voice->sends).SendCount = uVar12;
    pFVar5 = (FAudioSendDescriptor *)(*pFVar4->pMalloc)((ulong)pSendList->SendCount * 0xc);
    (voice->sends).pSends = pFVar5;
    SDL_memcpy(pFVar5,*ppFVar17,(ulong)pSendList->SendCount * 0xc);
    ppfVar6 = (float **)(*voice->audio->pMalloc)((ulong)pSendList->SendCount << 3);
    voice->sendCoefficients = ppfVar6;
    ppfVar6 = (float **)(*voice->audio->pMalloc)((ulong)pSendList->SendCount << 3);
    voice->mixCoefficients = ppfVar6;
    pp_Var7 = (FAudioMixCallback *)(*voice->audio->pMalloc)((ulong)pSendList->SendCount << 3);
    voice->sendMix = pp_Var7;
    if (pSendList->SendCount != 0) {
      lVar14 = 0;
      uVar16 = 0;
      do {
        lVar1 = *(long *)((long)&(*ppFVar17)->pOutputVoice + lVar14);
        uVar3 = *(uint *)((ulong)(*(int *)(lVar1 + 0xc) != 2) * 0x10 + 0xd8 + lVar1);
        lVar1 = (ulong)uVar3 * 4;
        pfVar8 = (float *)(*voice->audio->pMalloc)((ulong)voice->outputChannels * lVar1);
        voice->sendCoefficients[uVar16] = pfVar8;
        pfVar8 = (float *)(*voice->audio->pMalloc)((ulong)voice->outputChannels * lVar1);
        voice->mixCoefficients[uVar16] = pfVar8;
        SDL_memcpy(voice->sendCoefficients[uVar16],
                   FAUDIO_INTERNAL_MATRIX_DEFAULTS[voice->outputChannels - 1] + (uVar3 - 1),
                   (ulong)(voice->outputChannels * uVar3) << 2);
        FAudio_RecalcMixMatrix(voice,(uint32_t)uVar16);
        if (voice->outputChannels == 2) {
          pp_Var7 = &FAudio_INTERNAL_Mix_Generic;
          if (uVar3 - 1 < 8) {
            if ((0xa3U >> (uVar3 - 1 & 0x1f) & 1) != 0) {
              ppuVar13 = &PTR_FAudio_INTERNAL_Mix_2in_1out_Scalar_00131af8;
              goto LAB_00114c81;
            }
LAB_00114c6f:
            pp_Var7 = &FAudio_INTERNAL_Mix_Generic;
          }
        }
        else {
          pp_Var7 = &FAudio_INTERNAL_Mix_Generic;
          if (voice->outputChannels == 1) {
            pp_Var7 = &FAudio_INTERNAL_Mix_Generic;
            if (uVar3 - 1 < 8) {
              if ((0xa3U >> (uVar3 - 1 & 0x1f) & 1) == 0) goto LAB_00114c6f;
              ppuVar13 = &PTR_FAudio_INTERNAL_Mix_1in_1out_Scalar_00131ab8;
LAB_00114c81:
              pp_Var7 = (FAudioMixCallback *)(ppuVar13 + (uVar3 - 1));
            }
          }
        }
        voice->sendMix[uVar16] = *pp_Var7;
        if ((*(byte *)((long)&(*ppFVar17)->Flags + lVar14) & 0x80) != 0) {
          pFVar9 = voice->sendFilter;
          if (pFVar9 == (FAudioFilterParameters *)0x0) {
            pFVar9 = (FAudioFilterParameters *)
                     (*voice->audio->pMalloc)((ulong)pSendList->SendCount * 0xc);
            voice->sendFilter = pFVar9;
          }
          if (voice->sendFilterState == (FAudioFilterState **)0x0) {
            ppafVar10 = (FAudioFilterState **)
                        (*voice->audio->pMalloc)((ulong)pSendList->SendCount << 3);
            voice->sendFilterState = ppafVar10;
            SDL_memset(ppafVar10,0,(ulong)pSendList->SendCount << 3);
            pFVar9 = voice->sendFilter;
          }
          *(undefined4 *)((long)&pFVar9->Type + lVar14) = 0;
          *(undefined8 *)((long)&pFVar9->Frequency + lVar14) = 0x3f8000003f800000;
          sVar15 = (ulong)uVar3 << 4;
          pafVar11 = (FAudioFilterState *)(*voice->audio->pMalloc)(sVar15);
          voice->sendFilterState[uVar16] = pafVar11;
          SDL_memset(voice->sendFilterState[uVar16],0,sVar15);
        }
        uVar16 = uVar16 + 1;
        lVar14 = lVar14 + 0xc;
      } while (uVar16 < pSendList->SendCount);
    }
    FAudio_PlatformUnlockMutex(voice->volumeLock);
    FAudio_PlatformUnlockMutex(voice->sendLock);
    uVar12 = 0;
  }
  else {
LAB_00114990:
    FAudio_PlatformUnlockMutex(voice->sendLock);
  }
  return uVar12;
}

Assistant:

uint32_t FAudioVoice_SetOutputVoices(
	FAudioVoice *voice,
	const FAudioVoiceSends *pSendList
) {
	uint32_t i;
	uint32_t outChannels;
	FAudioVoiceSends defaultSends;
	FAudioSendDescriptor defaultSend;

	LOG_API_ENTER(voice->audio)

	if (voice->type == FAUDIO_VOICE_MASTER)
	{
		LOG_API_EXIT(voice->audio)
		return FAUDIO_E_INVALID_CALL;
	}

	FAudio_PlatformLockMutex(voice->sendLock);
	LOG_MUTEX_LOCK(voice->audio, voice->sendLock)

	if (FAudio_INTERNAL_VoiceOutputFrequency(voice, pSendList) != 0)
	{
		LOG_ERROR(
			voice->audio,
			"%s",
			"Changing the sample rate while an effect chain is attached is invalid!"
		)
		FAudio_PlatformUnlockMutex(voice->sendLock);
		LOG_MUTEX_UNLOCK(voice->audio, voice->sendLock)
		LOG_API_EXIT(voice->audio)
		return FAUDIO_E_INVALID_CALL;
	}

	FAudio_PlatformLockMutex(voice->volumeLock);
	LOG_MUTEX_LOCK(voice->audio, voice->volumeLock)

	/* FIXME: This is lazy... */
	for (i = 0; i < voice->sends.SendCount; i += 1)
	{
		voice->audio->pFree(voice->sendCoefficients[i]);
	}
	if (voice->sendCoefficients != NULL)
	{
		voice->audio->pFree(voice->sendCoefficients);
	}
	for (i = 0; i < voice->sends.SendCount; i += 1)
	{
		voice->audio->pFree(voice->mixCoefficients[i]);
	}
	if (voice->mixCoefficients != NULL)
	{
		voice->audio->pFree(voice->mixCoefficients);
	}
	if (voice->sendMix != NULL)
	{
		voice->audio->pFree(voice->sendMix);
	}
	if (voice->sendFilter != NULL)
	{
		voice->audio->pFree(voice->sendFilter);
		voice->sendFilter = NULL;
	}
	if (voice->sendFilterState != NULL)
	{
		for (i = 0; i < voice->sends.SendCount; i += 1)
		{
			if (voice->sendFilterState[i] != NULL)
			{
				voice->audio->pFree(voice->sendFilterState[i]);
			}
		}
		voice->audio->pFree(voice->sendFilterState);
		voice->sendFilterState = NULL;
	}
	if (voice->sends.pSends != NULL)
	{
		voice->audio->pFree(voice->sends.pSends);
	}

	if (pSendList == NULL)
	{
		/* Default to the mastering voice as output */
		defaultSend.Flags = 0;
		defaultSend.pOutputVoice = voice->audio->master;
		defaultSends.SendCount = 1;
		defaultSends.pSends = &defaultSend;
		pSendList = &defaultSends;
	}
	else if (pSendList->SendCount == 0)
	{
		/* No sends? Nothing to do... */
		voice->sendCoefficients = NULL;
		voice->mixCoefficients = NULL;
		voice->sendMix = NULL;
		FAudio_zero(&voice->sends, sizeof(FAudioVoiceSends));

		FAudio_PlatformUnlockMutex(voice->volumeLock);
		LOG_MUTEX_UNLOCK(voice->audio, voice->volumeLock)
		FAudio_PlatformUnlockMutex(voice->sendLock);
		LOG_MUTEX_UNLOCK(voice->audio, voice->sendLock)
		LOG_API_EXIT(voice->audio)
		return 0;
	}

	/* Copy send list */
	voice->sends.SendCount = pSendList->SendCount;
	voice->sends.pSends = (FAudioSendDescriptor*) voice->audio->pMalloc(
		pSendList->SendCount * sizeof(FAudioSendDescriptor)
	);
	FAudio_memcpy(
		voice->sends.pSends,
		pSendList->pSends,
		pSendList->SendCount * sizeof(FAudioSendDescriptor)
	);

	/* Allocate/Reset default output matrix, mixer function, filters */
	voice->sendCoefficients = (float**) voice->audio->pMalloc(
		sizeof(float*) * pSendList->SendCount
	);
	voice->mixCoefficients = (float**) voice->audio->pMalloc(
		sizeof(float*) * pSendList->SendCount
	);
	voice->sendMix = (FAudioMixCallback*) voice->audio->pMalloc(
		sizeof(FAudioMixCallback) * pSendList->SendCount
	);

	for (i = 0; i < pSendList->SendCount; i += 1)
	{
		if (pSendList->pSends[i].pOutputVoice->type == FAUDIO_VOICE_MASTER)
		{
			outChannels = pSendList->pSends[i].pOutputVoice->master.inputChannels;
		}
		else
		{
			outChannels = pSendList->pSends[i].pOutputVoice->mix.inputChannels;
		}
		voice->sendCoefficients[i] = (float*) voice->audio->pMalloc(
			sizeof(float) * voice->outputChannels * outChannels
		);
		voice->mixCoefficients[i] = (float*) voice->audio->pMalloc(
			sizeof(float) * voice->outputChannels * outChannels
		);

		FAudio_assert(voice->outputChannels > 0 && voice->outputChannels < 9);
		FAudio_assert(outChannels > 0 && outChannels < 9);
		FAudio_memcpy(
			voice->sendCoefficients[i],
			FAUDIO_INTERNAL_MATRIX_DEFAULTS[voice->outputChannels - 1][outChannels - 1],
			voice->outputChannels * outChannels * sizeof(float)
		);
		FAudio_RecalcMixMatrix(voice, i);

		if (voice->outputChannels == 1)
		{
			if (outChannels == 1)
			{
				voice->sendMix[i] = FAudio_INTERNAL_Mix_1in_1out_Scalar;
			}
			else if (outChannels == 2)
			{
				voice->sendMix[i] = FAudio_INTERNAL_Mix_1in_2out_Scalar;
			}
			else if (outChannels == 6)
			{
				voice->sendMix[i] = FAudio_INTERNAL_Mix_1in_6out_Scalar;
			}
			else if (outChannels == 8)
			{
				voice->sendMix[i] = FAudio_INTERNAL_Mix_1in_8out_Scalar;
			}
			else
			{
				voice->sendMix[i] = FAudio_INTERNAL_Mix_Generic;
			}
		}
		else if (voice->outputChannels == 2)
		{
			if (outChannels == 1)
			{
				voice->sendMix[i] = FAudio_INTERNAL_Mix_2in_1out_Scalar;
			}
			else if (outChannels == 2)
			{
				voice->sendMix[i] = FAudio_INTERNAL_Mix_2in_2out_Scalar;
			}
			else if (outChannels == 6)
			{
				voice->sendMix[i] = FAudio_INTERNAL_Mix_2in_6out_Scalar;
			}
			else if (outChannels == 8)
			{
				voice->sendMix[i] = FAudio_INTERNAL_Mix_2in_8out_Scalar;
			}
			else
			{
				voice->sendMix[i] = FAudio_INTERNAL_Mix_Generic;
			}
		}
		else
		{
			voice->sendMix[i] = FAudio_INTERNAL_Mix_Generic;
		}

		if (pSendList->pSends[i].Flags & FAUDIO_SEND_USEFILTER)
		{
			/* Allocate the whole send filter array if needed... */
			if (voice->sendFilter == NULL)
			{
				voice->sendFilter = (FAudioFilterParameters*) voice->audio->pMalloc(
					sizeof(FAudioFilterParameters) * pSendList->SendCount
				);
			}
			if (voice->sendFilterState == NULL)
			{
				voice->sendFilterState = (FAudioFilterState**) voice->audio->pMalloc(
					sizeof(FAudioFilterState*) * pSendList->SendCount
				);
				FAudio_zero(
					voice->sendFilterState,
					sizeof(FAudioFilterState*) * pSendList->SendCount
				);
			}

			/* ... then fill in this send's filter data */
			voice->sendFilter[i].Type = FAUDIO_DEFAULT_FILTER_TYPE;
			voice->sendFilter[i].Frequency = FAUDIO_DEFAULT_FILTER_FREQUENCY;
			voice->sendFilter[i].OneOverQ = FAUDIO_DEFAULT_FILTER_ONEOVERQ;
			voice->sendFilterState[i] = (FAudioFilterState*) voice->audio->pMalloc(
				sizeof(FAudioFilterState) * outChannels
			);
			FAudio_zero(
				voice->sendFilterState[i],
				sizeof(FAudioFilterState) * outChannels
			);
		}
	}

	FAudio_PlatformUnlockMutex(voice->volumeLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->volumeLock)

	FAudio_PlatformUnlockMutex(voice->sendLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->sendLock)
	LOG_API_EXIT(voice->audio)
	return 0;
}